

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void bag_explode(CHAR_DATA *ch,OBJ_DATA *obj,int everyone)

{
  CHAR_DATA *pCVar1;
  CHAR_DATA *ch_00;
  
  act("\x1b[1;31mA small bag of explosives detonates in a blinding flash of light!\x1b[0;37m",ch,obj
      ,(void *)0x0,0);
  act("\x1b[1;31mA small bag of explosives detonates in a blinding flash of light!\x1b[0;37m",ch,obj
      ,(void *)0x0,3);
  if (everyone == 3) {
    act("$n EXPLODES in an eruption of blood and fluids!",ch,(void *)0x0,(void *)0x0,0);
    send_to_char("You have EXPLODED!!\n\r",ch);
    unequip_char(ch,obj,true);
    extract_obj(obj);
LAB_00298d38:
    raw_kill(ch,ch);
    return;
  }
  if (everyone - 1U < 2) {
    pCVar1 = ch->in_room->people;
    while (ch_00 = pCVar1, ch_00 != (CHAR_DATA *)0x0) {
      pCVar1 = ch_00->next_in_room;
      if (ch_00 != ch) {
        act("$n EXPLODES in an eruption of blood and fluids!",ch_00,(void *)0x0,(void *)0x0,0);
        send_to_char("You have EXPLODED!!\n\r",ch_00);
        raw_kill(ch,ch_00);
      }
    }
    if (everyone != 2) {
      unequip_char(ch,obj,true);
      extract_obj(obj);
      act("$n EXPLODES in an eruption of blood and fluids!",ch,(void *)0x0,(void *)0x0,0);
      send_to_char("You have EXPLODED!!\n\r",ch);
      goto LAB_00298d38;
    }
  }
  return;
}

Assistant:

void bag_explode(CHAR_DATA *ch, OBJ_DATA *obj, int everyone)
{

	CHAR_DATA *vch;
	CHAR_DATA *vch_next;

	act("\x01B[1;31mA small bag of explosives detonates in a blinding flash of light!\x01B[0;37m", ch, obj, 0, TO_ROOM);
	act("\x01B[1;31mA small bag of explosives detonates in a blinding flash of light!\x01B[0;37m", ch, obj, 0, TO_CHAR);

	if (everyone == 3)
	{
		act("$n EXPLODES in an eruption of blood and fluids!", ch, 0, 0, TO_ROOM);
		send_to_char("You have EXPLODED!!\n\r", ch);
		unequip_char(ch, obj, true);
		extract_obj(obj);
		raw_kill(ch, ch);
	}
	else if (everyone == 2 || everyone == 1)
	{
		for (vch = ch->in_room->people; vch; vch = vch_next)
		{
			vch_next = vch->next_in_room;
			if (vch == ch)
				continue;

			act("$n EXPLODES in an eruption of blood and fluids!", vch, 0, 0, TO_ROOM);
			send_to_char("You have EXPLODED!!\n\r", vch);
			raw_kill(ch, vch);
		}

		if (everyone == 2)
			return;

		unequip_char(ch, obj, true);
		extract_obj(obj);
		act("$n EXPLODES in an eruption of blood and fluids!", ch, 0, 0, TO_ROOM);
		send_to_char("You have EXPLODED!!\n\r", ch);
		raw_kill(ch, ch);
	}
}